

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Armijo.cpp
# Opt level: O2

RealType __thiscall
QuantLib::ArmijoLineSearch::operator()
          (ArmijoLineSearch *this,Problem *P,Type *ecType,EndCriteria *endCriteria,RealType t_ini)

{
  DynamicVector<double,_std::allocator<double>_> *pDVar1;
  DynamicVector<double,_std::allocator<double>_> *pDVar2;
  double dVar3;
  bool bVar4;
  size_t iteration;
  RealType RVar5;
  double dVar6;
  double local_88;
  allocator_type local_79;
  RealType local_78;
  Constraint *local_70;
  DynamicVector<double,_std::allocator<double>_> *local_68;
  double local_60;
  Type *local_58;
  EndCriteria *local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_70 = P->constraint_;
  (this->super_LineSearch).succeed_ = true;
  local_78 = P->functionValue_;
  RVar5 = P->squaredNorm_;
  (this->super_LineSearch).qt_ = local_78;
  pDVar1 = &(this->super_LineSearch).gradient_;
  local_58 = ecType;
  local_50 = endCriteria;
  if ((this->super_LineSearch).gradient_.data_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      (this->super_LineSearch).gradient_.data_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    RVar5 = Problem::DotProduct(P,pDVar1,&(this->super_LineSearch).searchDirection_);
    RVar5 = -RVar5;
  }
  (this->super_LineSearch).qpt_ = RVar5;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(P->currentValue_).data_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_79);
  local_68 = pDVar1;
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&pDVar1->data_,&local_48);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  pDVar1 = &(this->super_LineSearch).xtd_;
  std::vector<double,_std::allocator<double>_>::operator=(&pDVar1->data_,&(P->currentValue_).data_);
  pDVar2 = &(this->super_LineSearch).searchDirection_;
  local_88 = LineSearch::update(&this->super_LineSearch,pDVar1,pDVar2,t_ini,local_70);
  RVar5 = Problem::value(P,pDVar1);
  (this->super_LineSearch).qt_ = RVar5;
  if (RVar5 - local_78 <= -this->alpha_ * local_88 * (this->super_LineSearch).qpt_) {
LAB_00212cb8:
    pDVar2 = local_68;
    Problem::gradient(P,local_68,pDVar1);
    RVar5 = Problem::DotProduct(P,pDVar2,pDVar2);
    (this->super_LineSearch).qpt_ = RVar5;
    return local_88;
  }
  iteration = 1;
  local_60 = RVar5;
LAB_00212be9:
  dVar3 = this->beta_;
  std::vector<double,_std::allocator<double>_>::operator=(&pDVar1->data_,&(P->currentValue_).data_);
  local_88 = LineSearch::update(&this->super_LineSearch,pDVar1,pDVar2,local_88 * dVar3,local_70);
  RVar5 = Problem::value(P,pDVar1);
  (this->super_LineSearch).qt_ = RVar5;
  Problem::gradient(P,local_68,pDVar1);
  bVar4 = EndCriteria::checkMaxIterations(local_50,iteration,local_58);
  dVar3 = (this->super_LineSearch).qt_;
  dVar6 = -this->alpha_ * local_88 * (this->super_LineSearch).qpt_;
  if (dVar3 - local_78 <= dVar6) {
    if (dVar6 / this->beta_ < local_60 - local_78 || bVar4) {
      if (!bVar4) goto LAB_00212cb8;
LAB_00212cb4:
      (this->super_LineSearch).succeed_ = false;
      goto LAB_00212cb8;
    }
  }
  else if (bVar4) goto LAB_00212cb4;
  iteration = iteration + 1;
  local_60 = dVar3;
  goto LAB_00212be9;
}

Assistant:

RealType ArmijoLineSearch::operator()(Problem& P, EndCriteria::Type& ecType,
                                        const EndCriteria& endCriteria,
                                        const RealType t_ini) {
    // OptimizationMethod& method = P.method();
    Constraint& constraint = P.constraint();
    succeed_               = true;
    bool maxIter           = false;
    RealType qtold, t = t_ini;
    size_t loopNumber = 0;

    RealType q0  = P.functionValue();
    RealType qp0 = P.gradientNormValue();

    qt_ = q0;
    qpt_ =
        (gradient_.empty()) ? qp0 : -P.DotProduct(gradient_, searchDirection_);

    // Initialize gradient
    gradient_ = DynamicVector<RealType>(P.currentValue().size());
    // Compute new point
    xtd_ = P.currentValue();
    t    = update(xtd_, searchDirection_, t, constraint);
    // Compute function value at the new point
    qt_ = P.value(xtd_);

    // Enter in the loop if the criterion is not satisfied
    if ((qt_ - q0) > -alpha_ * t * qpt_) {
      do {
        loopNumber++;
        // Decrease step
        t *= beta_;
        // Store old value of the function
        qtold = qt_;
        // New point value
        xtd_ = P.currentValue();
        t    = update(xtd_, searchDirection_, t, constraint);

        // Compute function value at the new point
        qt_ = P.value(xtd_);
        P.gradient(gradient_, xtd_);
        // and it squared norm
        maxIter = endCriteria.checkMaxIterations(loopNumber, ecType);
      } while ((((qt_ - q0) > (-alpha_ * t * qpt_)) ||
                ((qtold - q0) <= (-alpha_ * t * qpt_ / beta_))) &&
               (!maxIter));
    }

    if (maxIter) succeed_ = false;

    // Compute new gradient
    P.gradient(gradient_, xtd_);
    // and it squared norm
    // qpt_ = P.computeGradientNormValue(gradient_);
    qpt_ = P.DotProduct(gradient_, gradient_);

    // Return new step value
    return t;
  }